

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O1

void __thiscall xray_re::xr_skl_motion::~xr_skl_motion(xr_skl_motion *this)

{
  pointer ppxVar1;
  pointer ppxVar2;
  pointer ppxVar3;
  
  (this->super_xr_motion)._vptr_xr_motion = (_func_int **)&PTR__xr_skl_motion_0024a268;
  ppxVar1 = (this->m_bone_motions).
            super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar3 = (this->m_bone_motions).
                 super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppxVar3 != ppxVar1;
      ppxVar3 = ppxVar3 + 1) {
    if (*ppxVar3 != (xr_bone_motion *)0x0) {
      (*(*ppxVar3)->_vptr_xr_bone_motion[1])();
    }
  }
  delete_elements<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>>
            (&this->m_marks);
  ppxVar2 = (this->m_marks).
            super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppxVar2 != (pointer)0x0) {
    operator_delete(ppxVar2,(long)(this->m_marks).
                                  super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar2
                   );
  }
  ppxVar3 = (this->m_bone_motions).
            super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppxVar3 != (pointer)0x0) {
    operator_delete(ppxVar3,(long)(this->m_bone_motions).
                                  super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar3
                   );
  }
  xr_motion::~xr_motion(&this->super_xr_motion);
  return;
}

Assistant:

xr_skl_motion::~xr_skl_motion()
{
	delete_elements(m_bone_motions);
	delete_elements(m_marks);
}